

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O2

void __thiscall tcu::Matrix<float,_3,_3>::Matrix(Matrix<float,_3,_3> *this,float *src)

{
  int row;
  long lVar1;
  Vector<float,_3> *pVVar2;
  int col;
  long lVar3;
  
  Vector<tcu::Vector<float,_3>,_3>::Vector(&this->m_data);
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    pVVar2 = (Vector<float,_3> *)this;
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      ((Vector<tcu::Vector<float,_3>,_3> *)pVVar2->m_data)->m_data[0].m_data[0] = src[lVar3];
      pVVar2 = pVVar2 + 1;
    }
    src = src + 3;
    this = (Matrix<float,_3,_3> *)(((Vector<float,_3> *)this)->m_data + 1);
  }
  return;
}

Assistant:

Matrix<T, Rows, Cols>::Matrix (const T src[Rows*Cols])
{
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			(*this)(row, col) = src[row*Cols + col];
}